

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O2

void parseFontName(QString *name,QString *foundry,QString *family)

{
  Data *pDVar1;
  char16_t *pcVar2;
  bool bVar3;
  QChar QVar4;
  uint uVar5;
  qsizetype qVar6;
  qsizetype qVar7;
  QChar *pQVar8;
  ulong n;
  int iVar9;
  uint uVar10;
  long in_FS_OFFSET;
  bool bVar11;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  qVar6 = QString::indexOf(name,(QChar)0x5b,0,CaseSensitive);
  qVar7 = QString::lastIndexOf(name,(QChar)0x5d,CaseSensitive);
  uVar10 = (uint)qVar6;
  if (((int)uVar10 < (int)(uint)qVar7) && ((((uint)qVar7 | uVar10) & 0x80000000) == 0)) {
    QString::mid((longlong)&local_58,(longlong)name);
    pDVar1 = (foundry->d).d;
    pcVar2 = (foundry->d).ptr;
    (foundry->d).d = local_58.d;
    (foundry->d).ptr = local_58.ptr;
    qVar7 = (foundry->d).size;
    (foundry->d).size = local_58.size;
    local_58.d = pDVar1;
    local_58.ptr = pcVar2;
    local_58.size = qVar7;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    if ((int)uVar10 < 1) {
      n = 0;
    }
    else {
      uVar5 = (uint)(qVar6 + 0xffffffffU);
      if ((name->d).ptr[qVar6 + 0xffffffffU & 0xffffffff] != L' ') {
        uVar5 = uVar10;
      }
      n = (ulong)uVar5;
    }
    QString::left((QString *)&local_58,name,n);
    pDVar1 = (family->d).d;
    pcVar2 = (family->d).ptr;
    (family->d).d = local_58.d;
    (family->d).ptr = local_58.ptr;
    qVar6 = (family->d).size;
    (family->d).size = local_58.size;
    local_58.d = pDVar1;
    local_58.ptr = pcVar2;
    local_58.size = qVar6;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  }
  else {
    QString::clear(foundry);
    QString::operator=(family,(QString *)name);
  }
  pQVar8 = QString::data(family);
  iVar9 = (int)(family->d).size;
  bVar3 = true;
  while (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, bVar11) {
    if (bVar3 != false) {
      QVar4 = QChar::toUpper(pQVar8);
      pQVar8->ucs = QVar4.ucs;
    }
    bVar3 = QChar::isSpace(pQVar8);
    pQVar8 = pQVar8 + 1;
  }
  pQVar8 = QString::data(foundry);
  iVar9 = (int)(foundry->d).size;
  bVar3 = true;
  while (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, bVar11) {
    if (bVar3 != false) {
      QVar4 = QChar::toUpper(pQVar8);
      pQVar8->ucs = QVar4.ucs;
    }
    bVar3 = QChar::isSpace(pQVar8);
    pQVar8 = pQVar8 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void parseFontName(const QString &name, QString &foundry, QString &family)
{
    int i = name.indexOf(u'[');
    int li = name.lastIndexOf(u']');
    if (i >= 0 && li >= 0 && i < li) {
        foundry = name.mid(i + 1, li - i - 1);
        if (i > 0 && name[i - 1] == u' ')
            i--;
        family = name.left(i);
    } else {
        foundry.clear();
        family = name;
    }

    // capitalize the family/foundry names
    bool space = true;
    QChar *s = family.data();
    int len = family.size();
    while(len--) {
        if (space) *s = s->toUpper();
        space = s->isSpace();
        ++s;
    }

    space = true;
    s = foundry.data();
    len = foundry.size();
    while(len--) {
        if (space) *s = s->toUpper();
        space = s->isSpace();
        ++s;
    }
}